

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDAGetQuadSens1(void *ida_mem,sunrealtype *ptret,int is,N_Vector yyQSret)

{
  sunrealtype t;
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar1 = 0xea8;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar2 = -0x28;
    error_code = -0x28;
    iVar1 = 0xeb1;
  }
  else if (*(int *)((long)ida_mem + 0x110) == 0) {
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    iVar2 = -0x32;
    error_code = -0x32;
    iVar1 = 0xeb9;
  }
  else {
    if (yyQSret != (N_Vector)0x0) {
      t = *(sunrealtype *)((long)ida_mem + 0x500);
      *ptret = t;
      iVar1 = IDAGetQuadSensDky1(ida_mem,t,0,is,yyQSret);
      return iVar1;
    }
    msgfmt = "dky = NULL illegal.";
    iVar2 = -0x1b;
    error_code = -0x1b;
    iVar1 = 0xec1;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDAGetQuadSens1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDAGetQuadSens1(void* ida_mem, sunrealtype* ptret, int is, N_Vector yyQSret)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  if (IDA_mem->ida_quadr_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUADSENS);
  }

  if (yyQSret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  *ptret = IDA_mem->ida_tretlast;

  retval = IDAGetQuadSensDky1(ida_mem, *ptret, 0, is, yyQSret);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (retval);
}